

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_LadderDatabase.cpp
# Opt level: O0

pair<RenX::LadderDatabase::Entry_*,_unsigned_long> __thiscall
RenX::LadderDatabase::getPlayerEntryAndIndexByName(LadderDatabase *this,string_view name)

{
  bool bVar1;
  char *in_RCX;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  unsigned_long local_60;
  void *local_58;
  LadderDatabase *local_50;
  size_t local_48;
  Entry *local_40;
  Entry *itr;
  size_t index;
  LadderDatabase *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (LadderDatabase *)name._M_len;
  itr = (Entry *)0x0;
  local_40 = this->m_head;
  index = (size_t)this;
  while( true ) {
    if (local_40 == (Entry *)0x0) {
      local_58 = (void *)0x0;
      local_60 = 0xffffffffffffffff;
      std::pair<RenX::LadderDatabase::Entry_*,_unsigned_long>::
      pair<std::nullptr_t,_unsigned_long,_true>
                ((pair<RenX::LadderDatabase::Entry_*,_unsigned_long> *)&name_local._M_str,&local_58,
                 &local_60);
      return stack0xffffffffffffffe8;
    }
    local_50 = this_local;
    local_48 = name_local._M_len;
    rhs._M_str = in_RCX;
    rhs._M_len = name_local._M_len;
    bVar1 = jessilib::equalsi<char,char>
                      ((jessilib *)&local_40->most_recent_name,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       this_local,rhs);
    if (bVar1) break;
    local_40 = local_40->next;
    itr = (Entry *)((long)&itr->rank + 1);
  }
  std::pair<RenX::LadderDatabase::Entry_*,_unsigned_long>::
  pair<RenX::LadderDatabase::Entry_*&,_unsigned_long_&,_true>
            ((pair<RenX::LadderDatabase::Entry_*,_unsigned_long> *)&name_local._M_str,&local_40,
             (unsigned_long *)&itr);
  return stack0xffffffffffffffe8;
}

Assistant:

std::pair<RenX::LadderDatabase::Entry *, size_t> RenX::LadderDatabase::getPlayerEntryAndIndexByName(std::string_view name) const {
	size_t index = 0;
	for (Entry *itr = m_head; itr != nullptr; itr = itr->next, ++index) {
		if (jessilib::equalsi(itr->most_recent_name, name)) {
			return std::pair<Entry*, size_t>(itr, index);
		}
	}

	return std::pair<Entry*, size_t>(nullptr, SIZE_MAX);
}